

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong helper_bitrev_mips64(target_ulong rt)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = rt & 0xffff;
  uVar1 = 0;
  iVar3 = 0x10;
  do {
    uVar1 = ((uint)uVar2 & 1) + uVar1 * 2;
    uVar2 = uVar2 >> 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return (ulong)uVar1;
}

Assistant:

target_ulong helper_bitrev(target_ulong rt)
{
    int32_t temp;
    uint32_t rd;
    int i;

    temp = rt & MIPSDSP_LO;
    rd = 0;
    for (i = 0; i < 16; i++) {
        rd = (rd << 1) | (temp & 1);
        temp = temp >> 1;
    }

    return (target_ulong)rd;
}